

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O2

int Map_LibraryRead(Map_SuperLib_t *pLib,char *pFileName)

{
  char cVar1;
  uint uVar2;
  Extra_MmFlex_t *p;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  ulong uVar6;
  FILE *__stream_00;
  Mio_Library_t *pMVar7;
  ProgressBar *p_00;
  Map_Super_t *pGate;
  size_t sVar8;
  uint uVar9;
  byte *pbVar10;
  byte *__s;
  char *pcVar11;
  long lVar12;
  float fVar13;
  double dVar14;
  int nGatesTotal;
  uint (*local_17c8) [2];
  uint uTruthRes [2];
  uint local_17b0 [2];
  char Buffer [1000];
  char pBuffer [5000];
  
  if (pLib->pGenlib != (Mio_Library_t *)0x0) {
    __assert_fail("pLib->pGenlib == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                  ,0x37,"int Map_LibraryRead(Map_SuperLib_t *, char *)");
  }
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
    return 0;
  }
  __s = (byte *)0x0;
  while (pcVar5 = fgets(pBuffer,2000,__stream), pbVar10 = (byte *)pBuffer, pcVar5 != (char *)0x0) {
    while( true ) {
      uVar6 = (ulong)*pbVar10;
      __s = pbVar10;
      if (0x23 < uVar6) goto LAB_00367589;
      if ((0x100002400U >> (uVar6 & 0x3f) & 1) == 0) break;
      pbVar10 = pbVar10 + 1;
    }
    if ((0x800000001U >> (uVar6 & 0x3f) & 1) == 0) break;
  }
LAB_00367589:
  pcVar5 = strtok((char *)__s," \t\r\n");
  iVar3 = strcmp(pcVar5,"GATE");
  if (iVar3 == 0) {
    pcVar5 = pLib->pName;
    pcVar11 = "The input file \"%s\" looks like a genlib file and not a supergate library file.\n";
  }
  else {
    __stream_00 = fopen(pcVar5,"r");
    if (__stream_00 == (FILE *)0x0) {
      pcVar11 = "Cannot open the genlib file \"%s\".\n";
    }
    else {
      fclose(__stream_00);
      pMVar7 = Mio_LibraryRead(pcVar5,(char *)0x0,(char *)0x0,0);
      pLib->pGenlib = pMVar7;
      if (pMVar7 != (Mio_Library_t *)0x0) {
        __isoc99_fscanf(__stream,"%d\n",&pLib->nVarsMax);
        if (pLib->nVarsMax - 0xbU < 0xfffffff7) {
          pcVar5 = "Suspicious number of variables (%d).\n";
        }
        else {
          __isoc99_fscanf(__stream,"%d\n",&nGatesTotal);
          if (0xff67697f < nGatesTotal - 0x989681U) {
            p_00 = Extra_ProgressBarStart(_stdout,nGatesTotal);
            local_17c8 = pLib->uTruths;
            uVar9 = 0;
            while( true ) {
              pcVar11 = pBuffer;
              pcVar5 = fgets(pcVar11,5000,__stream);
              if (pcVar5 == (char *)0x0) break;
              for (; ((cVar1 = *pcVar11, cVar1 == '\n' || (cVar1 == '\r')) || (cVar1 == ' '));
                  pcVar11 = pcVar11 + 1) {
              }
              if (cVar1 != '\0') {
                uVar2 = pLib->nVarsMax;
                pGate = (Map_Super_t *)Extra_MmFixedEntryFetch(pLib->mmSupers);
                memset(pGate,0,0x100);
                pcVar5 = strtok(pcVar11," ");
                iVar3 = atoi(pcVar5);
                pGate->Num = iVar3;
                pcVar5 = strtok((char *)0x0," ");
                if (pLib->nVarsMax < 6) {
                  uVar4 = Extra_ReadBinary(pcVar5);
                  pGate->uTruth[0] = uVar4;
                  uVar4 = 0;
                }
                else {
                  uVar4 = Extra_ReadBinary(pcVar5 + 0x20);
                  pGate->uTruth[0] = uVar4;
                  pcVar5[0x20] = '\0';
                  uVar4 = Extra_ReadBinary(pcVar5);
                }
                pGate->uTruth[1] = uVar4;
                pcVar5 = strtok((char *)0x0," ");
                dVar14 = atof(pcVar5);
                (pGate->tDelayMax).Rise = (float)dVar14;
                (pGate->tDelayMax).Fall = (float)dVar14;
                if ((int)uVar2 < 1) {
                  uVar2 = 0;
                }
                lVar12 = 0;
                while( true ) {
                  pcVar5 = strtok((char *)0x0," ");
                  dVar14 = atof(pcVar5);
                  fVar13 = (float)dVar14;
                  if ((ulong)uVar2 * 0xc - lVar12 == 0) break;
                  *(float *)((long)&pGate->tDelaysR[0].Rise + lVar12) = fVar13;
                  *(float *)((long)&pGate->tDelaysF[0].Fall + lVar12) = fVar13;
                  lVar12 = lVar12 + 0xc;
                }
                pGate->Area = fVar13;
                pcVar5 = strtok((char *)0x0," \r\n");
                if (*pcVar5 == '\0') {
                  puts("A gate name is empty.");
                }
                p = pLib->mmForms;
                sVar8 = strlen(pcVar5);
                pcVar11 = Extra_MmFlexEntryFetch(p,(int)sVar8 + 1);
                pGate->pFormula = pcVar11;
                strcpy(pcVar11,pcVar5);
                pcVar5 = strtok((char *)0x0," \n");
                if (pcVar5 != (char *)0x0) {
                  printf("The following trailing symbols found \"%s\".\n",pcVar5);
                }
                uVar2 = pGate->Num;
                if (uVar2 != uVar9 + 1) {
                  __assert_fail("pGate->Num == nCounter + 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                                ,0x97,"int Map_LibraryReadFile(Map_SuperLib_t *, FILE *)");
                }
                for (pcVar5 = pGate->pFormula; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
                  *(uint *)&pGate->field_0x4 =
                       *(uint *)&pGate->field_0x4 & 0xffffff1f |
                       (uint)(*pcVar5 == '(') * 0x20 + *(uint *)&pGate->field_0x4 & 0xe0;
                }
                strcpy(Buffer,pGate->pFormula);
                Map_LibraryComputeTruth_rec(pLib,Buffer,local_17c8,uTruthRes);
                if ((uTruthRes[0] != pGate->uTruth[0]) || (uTruthRes[1] != pGate->uTruth[1])) {
                  __assert_fail("Map_LibraryTruthVerify(pLib, pGate)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                                ,0x9c,"int Map_LibraryReadFile(Map_SuperLib_t *, FILE *)");
                }
                iVar3 = Map_CanonComputeSlow
                                  (local_17c8,pLib->nVarsMax,pLib->nVarsMax,pGate->uTruth,
                                   pGate->uPhases,local_17b0);
                *(uint *)&pGate->field_0x4 = *(uint *)&pGate->field_0x4 & 0xfffffff | iVar3 << 0x1c;
                Map_SuperTableInsertC(pLib->tTableC,local_17b0,pGate);
                uVar9 = uVar2;
                if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= (int)uVar2)) {
                  Extra_ProgressBarUpdate_int(p_00,uVar2,(char *)0x0);
                }
              }
            }
            Extra_ProgressBarStop(p_00);
            pLib->nSupersAll = uVar9;
            iVar3 = 1;
            if (uVar9 != nGatesTotal) {
              printf("The number of gates read (%d) is different what the file says (%d).\n",
                     (ulong)(uint)nGatesTotal,(ulong)uVar9);
            }
            goto LAB_00367656;
          }
          pcVar5 = "Suspicious number of gates (%d).\n";
        }
        iVar3 = 0;
        printf(pcVar5);
        goto LAB_00367656;
      }
      pcVar11 = "Cannot read genlib file \"%s\".\n";
    }
  }
  iVar3 = 0;
  printf(pcVar11,pcVar5);
LAB_00367656:
  fclose(__stream);
  return iVar3;
}

Assistant:

int Map_LibraryRead( Map_SuperLib_t * pLib, char * pFileName )
{
    FILE * pFile;
    int Status;
    // read the beginning of the file
    assert( pLib->pGenlib == NULL );
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return 0;
    }
    Status = Map_LibraryReadFile( pLib, pFile );
    fclose( pFile );
//    Map_LibraryPrintClasses( pLib );
    return Status;
}